

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O3

int iothub_security_init(IOTHUB_SECURITY_TYPE sec_type)

{
  IOTHUB_SECURITY_TYPE IVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  
  if ((sec_type < (IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY|IOTHUB_SECURITY_TYPE_SAS)) &&
     ((0x16U >> (sec_type & 0x1f) & 1) != 0)) {
    g_security_type = sec_type;
    IVar1 = prov_dev_security_get_type();
    if (IVar1 == IOTHUB_SECURITY_TYPE_UNKNOWN) {
      iVar2 = prov_dev_security_init(sec_type);
      if (iVar2 == 0) goto LAB_0013243b;
    }
    else {
      if (IVar1 == sec_type) {
LAB_0013243b:
        iVar2 = initialize_hsm_system();
        return iVar2;
      }
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x4c;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                  ,"iothub_security_init",0x4b,1,
                  "Security type from caller %d (which maps to security device type %d) does not match already specified security device type %d"
                  ,sec_type,sec_type,(ulong)IVar1);
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x3f;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                ,"iothub_security_init",0x3e,1,"Security type %d is not supported in this SDK build"
                ,sec_type);
    }
  }
  return iVar2;
}

Assistant:

int iothub_security_init(IOTHUB_SECURITY_TYPE sec_type)
{
    int result;

    SECURE_DEVICE_TYPE secure_device_type_from_caller = get_secure_device_type(sec_type);

    if (secure_device_type_from_caller == SECURE_DEVICE_TYPE_UNKNOWN)
    {
        LogError("Security type %d is not supported in this SDK build", sec_type);
        result = MU_FAILURE;
    }
    else
    {
        g_security_type = sec_type;
        SECURE_DEVICE_TYPE security_device_type_from_prov = prov_dev_security_get_type();
        if (security_device_type_from_prov == SECURE_DEVICE_TYPE_UNKNOWN)
        {
            result = prov_dev_security_init(secure_device_type_from_caller);
        }
        else if (secure_device_type_from_caller != security_device_type_from_prov)
        {
            LogError("Security type from caller %d (which maps to security device type %d) does not match already specified security device type %d", sec_type, secure_device_type_from_caller, security_device_type_from_prov);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }

        if (result == 0)
        {
            result = initialize_hsm_system();
        }
    }
    return result;
}